

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVDB.h
# Opt level: O1

Tile * __thiscall
nanovdb::
RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
::findTile(RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
           *this,CoordType *ijk)

{
  long lVar1;
  Tile *pTVar2;
  
  lVar1 = (long)(int)(this->
                     super_RootData<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                     ).mTileCount;
  if (0 < lVar1) {
    pTVar2 = (Tile *)(this + 1);
    do {
      if (pTVar2->key ==
          ((ulong)((uint)ijk->mVec[0] >> 0xc) << 0x2a |
          (ulong)((uint)ijk->mVec[1] >> 0xc) << 0x15 | (ulong)((uint)ijk->mVec[2] >> 0xc))) {
        return pTVar2;
      }
      pTVar2 = pTVar2 + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return (Tile *)0x0;
}

Assistant:

__hostdev__ const Tile* findTile(const CoordType& ijk) const
    {
        // binary-search of pre-sorted elements
        int32_t     low = 0, high = DataType::mTileCount; // low is inclusive and high is exclusive
        const Tile* tiles = reinterpret_cast<const Tile*>(this + 1);
        const auto  key = DataType::CoordToKey(ijk);
#if 1 // switch between linear and binary seach
        for (int i = low; i < high; i++) {
            const Tile* tile = &tiles[i];
            if (tile->key == key)
                return tile;
        }
#else
        while (low != high) {
            int         mid = low + ((high - low) >> 1);
            const Tile* tile = &tiles[mid];
            if (tile->key == key) {
                return tile;
            } else if (tile->key < key) {
                low = mid + 1;
            } else {
                high = mid;
            }
        }
#endif
        return nullptr;
    }